

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O0

MTBDD mtbdd_makemapnode(uint32_t var,MTBDD low,MTBDD high)

{
  FILE *__stream;
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  int local_3c;
  uint64_t uStack_38;
  int created;
  uint64_t index;
  mtbddnode n;
  MTBDD high_local;
  MTBDD low_local;
  uint32_t var_local;
  
  n.b = high;
  iVar1 = MTBDD_HASMARK(low);
  if (iVar1 != 0) {
    __assert_fail("!MTBDD_HASMARK(low)",
                  "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_mtbdd.c"
                  ,0x1f5,"MTBDD mtbdd_makemapnode(uint32_t, MTBDD, MTBDD)");
  }
  mtbddnode_makemapnode((mtbddnode_t)&index,var,low,n.b);
  uStack_38 = llmsset_lookup(nodes,index,n.a,&local_3c);
  if (uStack_38 == 0) {
    mtbdd_refs_push(low);
    mtbdd_refs_push(n.b);
    sylvan_gc_RUN();
    mtbdd_refs_pop(2);
    uStack_38 = llmsset_lookup(nodes,index,n.a,&local_3c);
    __stream = _stderr;
    if (uStack_38 == 0) {
      sVar2 = llmsset_count_marked_RUN(nodes);
      sVar3 = llmsset_get_size(nodes);
      fprintf(__stream,"BDD Unique table full, %zu of %zu buckets filled!\n",sVar2,sVar3);
      exit(1);
    }
  }
  if (local_3c == 0) {
    sylvan_stats_count(1);
  }
  else {
    sylvan_stats_count(0);
  }
  return uStack_38;
}

Assistant:

MTBDD
mtbdd_makemapnode(uint32_t var, MTBDD low, MTBDD high)
{
    struct mtbddnode n;
    uint64_t index;
    int created;

    // in an MTBDDMAP, the low edges eventually lead to 0 and cannot have a low mark
    assert(!MTBDD_HASMARK(low));

    mtbddnode_makemapnode(&n, var, low, high);
    index = llmsset_lookup(nodes, n.a, n.b, &created);
    if (index == 0) {
        mtbdd_refs_push(low);
        mtbdd_refs_push(high);
        RUN(sylvan_gc);
        mtbdd_refs_pop(2);

        index = llmsset_lookup(nodes, n.a, n.b, &created);
        if (index == 0) {
            fprintf(stderr, "BDD Unique table full, %zu of %zu buckets filled!\n", llmsset_count_marked(nodes), llmsset_get_size(nodes));
            exit(1);
        }
    }

    if (created) sylvan_stats_count(BDD_NODES_CREATED);
    else sylvan_stats_count(BDD_NODES_REUSED);

    return index;
}